

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O0

PDFFormXObject * __thiscall
TIFFImageHandler::CreateFormXObjectFromTIFFFile
          (TIFFImageHandler *this,string *inTIFFFilePath,ObjectIDType inFormXObjectID,
          TIFFUsageParameters *inTIFFUsageParameters)

{
  EStatusCode EVar1;
  Trace *this_00;
  undefined8 uVar2;
  IByteReaderWithPosition *inTIFFStream;
  undefined1 local_60 [8];
  InputFile tiffFile;
  TIFFUsageParameters *inTIFFUsageParameters_local;
  ObjectIDType inFormXObjectID_local;
  string *inTIFFFilePath_local;
  TIFFImageHandler *this_local;
  
  tiffFile.mFileStream = (InputFileStream *)inTIFFUsageParameters;
  InputFile::InputFile((InputFile *)local_60);
  EVar1 = InputFile::OpenFile((InputFile *)local_60,inTIFFFilePath);
  if (EVar1 == eSuccess) {
    inTIFFStream = InputFile::GetInputStream((InputFile *)local_60);
    this_local = (TIFFImageHandler *)
                 CreateFormXObjectFromTIFFStream
                           (this,inTIFFStream,inFormXObjectID,
                            (TIFFUsageParameters *)tiffFile.mFileStream);
  }
  else {
    this_00 = Trace::DefaultTrace();
    uVar2 = std::__cxx11::string::c_str();
    Trace::TraceToLog(this_00,
                      "TIFFImageHandler::CreateFormXObjectFromTIFFFile. cannot open file for reading - %s"
                      ,uVar2);
    this_local = (TIFFImageHandler *)0x0;
  }
  InputFile::~InputFile((InputFile *)local_60);
  return (PDFFormXObject *)this_local;
}

Assistant:

PDFFormXObject* TIFFImageHandler::CreateFormXObjectFromTIFFFile(const std::string& inTIFFFilePath,
																ObjectIDType inFormXObjectID,
																const TIFFUsageParameters& inTIFFUsageParameters)

{
	InputFile tiffFile;

	if(tiffFile.OpenFile(inTIFFFilePath) != PDFHummus::eSuccess)
	{
		TRACE_LOG1("TIFFImageHandler::CreateFormXObjectFromTIFFFile. cannot open file for reading - %s",inTIFFFilePath.c_str());
		return NULL;
	}
		
	return CreateFormXObjectFromTIFFStream(tiffFile.GetInputStream(),inFormXObjectID,inTIFFUsageParameters);
}